

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O2

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetDeviceOutputSubsamples
          (VClient *this,string *i_rDeviceName,string *i_rDeviceOutputName,string *i_rComponentName,
          uint *o_rDeviceOutputSubsamples,bool *o_rbOccluded)

{
  long lVar1;
  string *psVar2;
  pointer pVVar3;
  pointer pVVar4;
  pointer pVVar5;
  pointer pVVar6;
  VClient *pVVar7;
  bool bVar8;
  __type _Var9;
  VDeviceInfo *pVVar10;
  pointer pVVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  char *pcVar15;
  pointer pVVar16;
  pointer pVVar17;
  pointer pVVar18;
  pointer pVVar19;
  Enum EVar20;
  VClient *pVVar21;
  uint uVar22;
  string *i_rDeviceOutputName_00;
  bool *pbVar23;
  uint *puVar24;
  Enum GetResult;
  UInt64 local_b8;
  VClient *local_b0;
  pointer local_a8;
  uint local_9c;
  uint *local_98;
  bool *local_90;
  UInt64 local_88;
  pointer local_80;
  string *local_78;
  TPeriod FramePeriod;
  scoped_lock Lock;
  
  local_78 = i_rComponentName;
  boost::unique_lock<boost::recursive_mutex>::unique_lock(&Lock,&this->m_FrameMutex);
  GetResult = Success;
  local_b0 = this;
  bVar8 = InitGet<unsigned_int>(this,&GetResult,o_rDeviceOutputSubsamples);
  EVar20 = GetResult;
  if ((bVar8) &&
     (pVVar10 = GetDevice(local_b0,i_rDeviceName,&GetResult), pVVar21 = local_b0, EVar20 = GetResult
     , pVVar10 != (VDeviceInfo *)0x0)) {
    local_9c = pVVar10->m_DeviceID;
    local_b8 = pVVar10->m_FramePeriod;
    local_98 = o_rDeviceOutputSubsamples;
    local_90 = o_rbOccluded;
    local_88 = GetDeviceStartTick(local_b0,local_9c);
    lVar1 = (pVVar21->m_LatestFrame).m_Stream.m_FramePeriod;
    FramePeriod.first = (ulong)(pVVar21->m_LatestFrame).m_Frame.m_FrameID * lVar1;
    FramePeriod.second = lVar1 + FramePeriod.first;
    local_80 = (pVVar21->m_LatestFrame).m_Channels.
               super__Vector_base<ViconCGStream::VChannelInfo,_std::allocator<ViconCGStream::VChannelInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    uVar22 = 0;
    pVVar11 = (pVVar21->m_LatestFrame).m_Channels.
              super__Vector_base<ViconCGStream::VChannelInfo,_std::allocator<ViconCGStream::VChannelInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    while (pVVar11 != local_80) {
      local_a8 = pVVar11;
      if ((pVVar11->m_DeviceID == local_9c) &&
         ((i_rDeviceOutputName->_M_string_length == 0 ||
          (bVar8 = std::operator!=(&pVVar11->m_Name,i_rDeviceOutputName), !bVar8)))) {
        i_rDeviceOutputName_00 =
             (local_a8->m_ComponentNames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        psVar2 = (local_a8->m_ComponentNames).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (i_rDeviceOutputName_00 == psVar2) {
          EVar20 = NoFrame;
          goto LAB_0012498b;
        }
        for (; i_rDeviceOutputName_00 != psVar2; i_rDeviceOutputName_00 = i_rDeviceOutputName_00 + 1
            ) {
          ClientUtils::AdaptDeviceOutputName
                    ((string *)&stack0xffffffffffffffb0,i_rDeviceOutputName_00,uVar22);
          _Var9 = std::operator==(local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&stack0xffffffffffffffb0);
          pVVar21 = (VClient *)&stack0xffffffffffffffb0;
          std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
          pVVar11 = local_a8;
          if (_Var9) {
            bVar8 = IsForcePlateForceChannel(pVVar21,local_a8);
            if (bVar8) {
              pVVar16 = (local_b0->m_LatestFrame).m_Forces.
                        super__Vector_base<ViconCGStream::VForceFrame,_std::allocator<ViconCGStream::VForceFrame>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pVVar3 = (local_b0->m_LatestFrame).m_Forces.
                       super__Vector_base<ViconCGStream::VForceFrame,_std::allocator<ViconCGStream::VForceFrame>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              *local_98 = 0;
              uVar14 = (long)(pVVar11->m_ComponentNames).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pVVar11->m_ComponentNames).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5;
              goto LAB_001246f7;
            }
            bVar8 = IsForcePlateMomentChannel(pVVar21,pVVar11);
            pbVar23 = local_90;
            puVar24 = local_98;
            pVVar7 = local_b0;
            if (bVar8) {
              pVVar17 = (local_b0->m_LatestFrame).m_Moments.
                        super__Vector_base<ViconCGStream::VMomentFrame,_std::allocator<ViconCGStream::VMomentFrame>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pVVar4 = (local_b0->m_LatestFrame).m_Moments.
                       super__Vector_base<ViconCGStream::VMomentFrame,_std::allocator<ViconCGStream::VMomentFrame>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              *local_98 = 0;
              uVar14 = (long)(pVVar11->m_ComponentNames).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pVVar11->m_ComponentNames).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5;
              goto LAB_00124772;
            }
            bVar8 = IsForcePlateCoPChannel(pVVar21,pVVar11);
            if (!bVar8) {
              pVVar19 = (pVVar7->m_LatestFrame).m_Voltages.
                        super__Vector_base<ViconCGStream::VVoltageFrame,_std::allocator<ViconCGStream::VVoltageFrame>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pVVar6 = (pVVar7->m_LatestFrame).m_Voltages.
                       super__Vector_base<ViconCGStream::VVoltageFrame,_std::allocator<ViconCGStream::VVoltageFrame>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              *puVar24 = 0;
              uVar14 = (long)(pVVar11->m_ComponentNames).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pVVar11->m_ComponentNames).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5;
              goto LAB_0012488a;
            }
            pVVar18 = (pVVar7->m_LatestFrame).m_CentresOfPressure.
                      super__Vector_base<ViconCGStream::VCentreOfPressureFrame,_std::allocator<ViconCGStream::VCentreOfPressureFrame>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pVVar5 = (pVVar7->m_LatestFrame).m_CentresOfPressure.
                     super__Vector_base<ViconCGStream::VCentreOfPressureFrame,_std::allocator<ViconCGStream::VCentreOfPressureFrame>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            *puVar24 = 0;
            uVar14 = (long)(pVVar11->m_ComponentNames).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pVVar11->m_ComponentNames).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5;
            goto LAB_001247e2;
          }
          uVar22 = uVar22 + 1;
        }
      }
      pVVar11 = local_a8 + 1;
    }
    EVar20 = InvalidDeviceOutputName;
  }
LAB_0012498b:
  boost::unique_lock<boost::recursive_mutex>::~unique_lock(&Lock);
  return EVar20;
LAB_001246f7:
  bVar8 = pVVar16 == pVVar3;
  pbVar23 = local_90;
  if (bVar8) goto LAB_00124985;
  if (((pVVar16->m_DeviceID == pVVar11->m_DeviceID) &&
      (pVVar16->m_ChannelID == pVVar11->m_ChannelID)) &&
     (uVar12 = (long)(pVVar16->m_Samples).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pVVar16->m_Samples).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2, uVar14 - 1 < uVar12)) {
    uVar13 = uVar12 / uVar14;
    if (uVar12 % uVar14 != 0) {
      pcVar15 = 
      "bool ViconDataStreamSDK::Core::(anonymous namespace)::GetSampleCount(const std::vector<TFrame> &, const ViconCGStream::VChannelInfo &, const ViconCGStreamType::UInt64, const ViconCGStreamType::UInt64, const TPeriod &, unsigned int &) [TFrame = ViconCGStream::VForceFrame]"
      ;
      goto LAB_00124a03;
    }
    puVar24 = local_98;
    if (local_b8 % uVar13 == 0) goto LAB_00124968;
    pcVar15 = 
    "bool ViconDataStreamSDK::Core::(anonymous namespace)::GetSampleCount(const std::vector<TFrame> &, const ViconCGStream::VChannelInfo &, const ViconCGStreamType::UInt64, const ViconCGStreamType::UInt64, const TPeriod &, unsigned int &) [TFrame = ViconCGStream::VForceFrame]"
    ;
    goto LAB_00124a22;
  }
  pVVar16 = pVVar16 + 1;
  goto LAB_001246f7;
LAB_00124772:
  bVar8 = pVVar17 == pVVar4;
  if (bVar8) goto LAB_00124985;
  if (((pVVar17->m_DeviceID == pVVar11->m_DeviceID) &&
      (pVVar17->m_ChannelID == pVVar11->m_ChannelID)) &&
     (uVar12 = (long)(pVVar17->m_Samples).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pVVar17->m_Samples).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2, uVar14 - 1 < uVar12)) {
    uVar13 = uVar12 / uVar14;
    if (uVar12 % uVar14 != 0) {
      pcVar15 = 
      "bool ViconDataStreamSDK::Core::(anonymous namespace)::GetSampleCount(const std::vector<TFrame> &, const ViconCGStream::VChannelInfo &, const ViconCGStreamType::UInt64, const ViconCGStreamType::UInt64, const TPeriod &, unsigned int &) [TFrame = ViconCGStream::VMomentFrame]"
      ;
      goto LAB_00124a03;
    }
    if (local_b8 % uVar13 == 0) goto LAB_00124968;
    pcVar15 = 
    "bool ViconDataStreamSDK::Core::(anonymous namespace)::GetSampleCount(const std::vector<TFrame> &, const ViconCGStream::VChannelInfo &, const ViconCGStreamType::UInt64, const ViconCGStreamType::UInt64, const TPeriod &, unsigned int &) [TFrame = ViconCGStream::VMomentFrame]"
    ;
    goto LAB_00124a22;
  }
  pVVar17 = pVVar17 + 1;
  goto LAB_00124772;
LAB_001247e2:
  bVar8 = pVVar18 == pVVar5;
  if (bVar8) goto LAB_00124985;
  if (((pVVar18->m_DeviceID == pVVar11->m_DeviceID) &&
      (pVVar18->m_ChannelID == pVVar11->m_ChannelID)) &&
     (uVar12 = (long)(pVVar18->m_Samples).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pVVar18->m_Samples).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2, uVar14 - 1 < uVar12)) {
    uVar13 = uVar12 / uVar14;
    if (uVar12 % uVar14 != 0) {
      pcVar15 = 
      "bool ViconDataStreamSDK::Core::(anonymous namespace)::GetSampleCount(const std::vector<TFrame> &, const ViconCGStream::VChannelInfo &, const ViconCGStreamType::UInt64, const ViconCGStreamType::UInt64, const TPeriod &, unsigned int &) [TFrame = ViconCGStream::VCentreOfPressureFrame]"
      ;
      goto LAB_00124a03;
    }
    if (local_b8 % uVar13 == 0) goto LAB_00124968;
    pcVar15 = 
    "bool ViconDataStreamSDK::Core::(anonymous namespace)::GetSampleCount(const std::vector<TFrame> &, const ViconCGStream::VChannelInfo &, const ViconCGStreamType::UInt64, const ViconCGStreamType::UInt64, const TPeriod &, unsigned int &) [TFrame = ViconCGStream::VCentreOfPressureFrame]"
    ;
    goto LAB_00124a22;
  }
  pVVar18 = pVVar18 + 1;
  goto LAB_001247e2;
LAB_0012488a:
  bVar8 = pVVar19 == pVVar6;
  if (bVar8) goto LAB_00124985;
  if (((pVVar19->m_DeviceID == pVVar11->m_DeviceID) &&
      (pVVar19->m_ChannelID == pVVar11->m_ChannelID)) &&
     (uVar12 = (long)(pVVar19->m_Samples).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pVVar19->m_Samples).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2, uVar14 - 1 < uVar12)) {
    uVar13 = uVar12 / uVar14;
    if (uVar12 % uVar14 != 0) {
      pcVar15 = 
      "bool ViconDataStreamSDK::Core::(anonymous namespace)::GetSampleCount(const std::vector<TFrame> &, const ViconCGStream::VChannelInfo &, const ViconCGStreamType::UInt64, const ViconCGStreamType::UInt64, const TPeriod &, unsigned int &) [TFrame = ViconCGStream::VVoltageFrame]"
      ;
LAB_00124a03:
      __assert_fail("NumberOfSampleComponents % Components == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/whoenig[P]vicon-datastream-sdk/Vicon/CrossMarket/DataStream/ViconDataStreamSDKCore/CoreClient.cpp"
                    ,0xeed,pcVar15);
    }
    if (local_b8 % uVar13 != 0) {
      pcVar15 = 
      "bool ViconDataStreamSDK::Core::(anonymous namespace)::GetSampleCount(const std::vector<TFrame> &, const ViconCGStream::VChannelInfo &, const ViconCGStreamType::UInt64, const ViconCGStreamType::UInt64, const TPeriod &, unsigned int &) [TFrame = ViconCGStream::VVoltageFrame]"
      ;
LAB_00124a22:
      __assert_fail("i_DevicePeriod % NumSamples == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/whoenig[P]vicon-datastream-sdk/Vicon/CrossMarket/DataStream/ViconDataStreamSDKCore/CoreClient.cpp"
                    ,0xef1,pcVar15);
    }
LAB_00124968:
    uVar22 = anon_unknown.dwarf_96a3f::GetSamplesInFrame(&FramePeriod,local_88,local_b8 / uVar13);
    *puVar24 = uVar22;
LAB_00124985:
    *pbVar23 = bVar8;
    EVar20 = Success;
    goto LAB_0012498b;
  }
  pVVar19 = pVVar19 + 1;
  goto LAB_0012488a;
}

Assistant:

Result::Enum VClient::GetDeviceOutputSubsamples( const std::string  & i_rDeviceName,
                                                 const std::string  & i_rDeviceOutputName, 
                                                 const std::string  & i_rComponentName,
                                                       unsigned int & o_rDeviceOutputSubsamples,
                                                       bool         & o_rbOccluded ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );

  Result::Enum GetResult = Result::Success;
  if ( !InitGet( GetResult, o_rDeviceOutputSubsamples ) )
  {
    return GetResult; 
  }

  const ViconCGStream::VDeviceInfo * pDevice = GetDevice( i_rDeviceName, GetResult );
  if ( !pDevice )
  {
    return GetResult; 
  }
  const unsigned int DeviceID = pDevice->m_DeviceID;
  const ViconCGStreamType::UInt64 DevicePeriod = pDevice->m_FramePeriod;

  ViconCGStreamType::Int64 DeviceStartTick = GetDeviceStartTick( DeviceID );

  const TPeriod FramePeriod = GetFramePeriod( m_LatestFrame );

  // Iterate over the channels for this device
  unsigned int CurrentDeviceOutputIndex = 0;
  std::vector< ViconCGStream::VChannelInfo >::const_iterator ChannelIt  = m_LatestFrame.m_Channels.begin();
  std::vector< ViconCGStream::VChannelInfo >::const_iterator ChannelEnd = m_LatestFrame.m_Channels.end();
  for ( ; ChannelIt != ChannelEnd; ++ChannelIt )
  {
    const ViconCGStream::VChannelInfo & rChannel( *ChannelIt );

    // Wrong device
    if ( rChannel.m_DeviceID != DeviceID )
    {
      continue;
    }

    if ( !i_rDeviceOutputName.empty() )
    {
      if ( rChannel.m_Name != i_rDeviceOutputName )
      {
        continue;
      }
    }

    if( rChannel.m_ComponentNames.empty() )
    {
      return Result::NoFrame;
    }

    std::vector< std::string >::const_iterator ComponentIt  = rChannel.m_ComponentNames.begin();
    std::vector< std::string >::const_iterator ComponentEnd = rChannel.m_ComponentNames.end();
    for( unsigned int ComponentIndex = 0 ; ComponentIt != ComponentEnd ; ++ComponentIt, ++ComponentIndex, ++CurrentDeviceOutputIndex )
    {
      if( i_rComponentName == AdaptDeviceOutputName( *ComponentIt, CurrentDeviceOutputIndex ) )
      {
        // This is the correct component.
        // Find the correct data array.

        if( IsForcePlateForceChannel( rChannel ) )
        {
          o_rbOccluded = !GetSampleCount( m_LatestFrame.m_Forces, rChannel, DevicePeriod, DeviceStartTick, FramePeriod, o_rDeviceOutputSubsamples );
        }
        else if( IsForcePlateMomentChannel( rChannel ) )
        {
          o_rbOccluded = !GetSampleCount( m_LatestFrame.m_Moments, rChannel, DevicePeriod, DeviceStartTick, FramePeriod, o_rDeviceOutputSubsamples );
        }
        else if( IsForcePlateCoPChannel( rChannel ) )
        {
          o_rbOccluded = !GetSampleCount( m_LatestFrame.m_CentresOfPressure, rChannel, DevicePeriod, DeviceStartTick, FramePeriod, o_rDeviceOutputSubsamples );
        }
        else
        {
          o_rbOccluded = !GetSampleCount( m_LatestFrame.m_Voltages, rChannel, DevicePeriod, DeviceStartTick, FramePeriod, o_rDeviceOutputSubsamples );
        }

        return Result::Success;
      }
    }
  }

  return Result::InvalidDeviceOutputName;
}